

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

void uv_os_free_environ(uv_env_item_t *envitems,int count)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  if (0 < count) {
    piVar2 = __errno_location();
    lVar3 = 0;
    do {
      iVar1 = *piVar2;
      (*(code *)uv__allocator_3)(*(undefined8 *)((long)&envitems->name + lVar3));
      *piVar2 = iVar1;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)count << 4 != lVar3);
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  (*(code *)uv__allocator_3)(envitems);
  *piVar2 = iVar1;
  return;
}

Assistant:

void uv_os_free_environ(uv_env_item_t* envitems, int count) {
  int i;

  for (i = 0; i < count; i++) {
    uv__free(envitems[i].name);
  }

  uv__free(envitems);
}